

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bpacking.cpp
# Opt level: O3

uint32_t * unpack25_16(uint32_t base,uint32_t *in,uint32_t *out)

{
  uint uVar1;
  
  *out = (*in & 0x1ffffff) + base;
  uVar1 = *in;
  out[1] = uVar1 >> 0x19;
  out[1] = (uVar1 >> 0x19) + base + (in[1] & 0x3ffff) * 0x80;
  uVar1 = in[1];
  out[2] = uVar1 >> 0x12;
  out[2] = (uVar1 >> 0x12) + base + (in[2] & 0x7ff) * 0x4000;
  uVar1 = in[2];
  out[3] = uVar1 >> 0xb;
  out[3] = (uVar1 >> 0xb) + base + (in[3] & 0xf) * 0x200000;
  out[4] = (in[3] >> 4 & 0x1ffffff) + base;
  uVar1 = in[3];
  out[5] = uVar1 >> 0x1d;
  out[5] = (uVar1 >> 0x1d) + base + (in[4] & 0x3fffff) * 8;
  uVar1 = in[4];
  out[6] = uVar1 >> 0x16;
  out[6] = (uVar1 >> 0x16) + base + (in[5] & 0x7fff) * 0x400;
  uVar1 = in[5];
  out[7] = uVar1 >> 0xf;
  out[7] = (uVar1 >> 0xf) + base + (in[6] & 0xff) * 0x20000;
  uVar1 = in[6];
  out[8] = uVar1 >> 8;
  out[8] = (uVar1 >> 8) + base + (in[7] & 1) * 0x1000000;
  out[9] = (in[7] >> 1 & 0x1ffffff) + base;
  uVar1 = in[7];
  out[10] = uVar1 >> 0x1a;
  out[10] = (uVar1 >> 0x1a) + base + (in[8] & 0x7ffff) * 0x40;
  uVar1 = in[8];
  out[0xb] = uVar1 >> 0x13;
  out[0xb] = (uVar1 >> 0x13) + base + (in[9] & 0xfff) * 0x2000;
  uVar1 = in[9];
  out[0xc] = uVar1 >> 0xc;
  out[0xc] = (uVar1 >> 0xc) + base + (in[10] & 0x1f) * 0x100000;
  out[0xd] = (in[10] >> 5 & 0x1ffffff) + base;
  uVar1 = in[10];
  out[0xe] = uVar1 >> 0x1e;
  out[0xe] = (uVar1 >> 0x1e) + base + (in[0xb] & 0x7fffff) * 4;
  uVar1 = in[0xb];
  out[0xf] = uVar1 >> 0x17;
  out[0xf] = (uVar1 >> 0x17) + base + (in[0xc] & 0xffff) * 0x200;
  return in + 0xd;
}

Assistant:

uint32_t * unpack25_16( uint32_t base,  uint32_t *   in, uint32_t *    out) {

    *out = ( (*in) >>  0  )   % (1U << 25 )  ;
    *out += base;
    out++;
    *out = ( (*in) >>  25  ) ;
    ++in;
    *out |= ((*in) % (1U<< 18 ))<<( 25 - 18 );
    *out += base;
    out++;
    *out = ( (*in) >>  18  ) ;
    ++in;
    *out |= ((*in) % (1U<< 11 ))<<( 25 - 11 );
    *out += base;
    out++;
    *out = ( (*in) >>  11  ) ;
    ++in;
    *out |= ((*in) % (1U<< 4 ))<<( 25 - 4 );
    *out += base;
    out++;
    *out = ( (*in) >>  4  )   % (1U << 25 )  ;
    *out += base;
    out++;
    *out = ( (*in) >>  29  ) ;
    ++in;
    *out |= ((*in) % (1U<< 22 ))<<( 25 - 22 );
    *out += base;
    out++;
    *out = ( (*in) >>  22  ) ;
    ++in;
    *out |= ((*in) % (1U<< 15 ))<<( 25 - 15 );
    *out += base;
    out++;
    *out = ( (*in) >>  15  ) ;
    ++in;
    *out |= ((*in) % (1U<< 8 ))<<( 25 - 8 );
    *out += base;
    out++;
    *out = ( (*in) >>  8  ) ;
    ++in;
    *out |= ((*in) % (1U<< 1 ))<<( 25 - 1 );
    *out += base;
    out++;
    *out = ( (*in) >>  1  )   % (1U << 25 )  ;
    *out += base;
    out++;
    *out = ( (*in) >>  26  ) ;
    ++in;
    *out |= ((*in) % (1U<< 19 ))<<( 25 - 19 );
    *out += base;
    out++;
    *out = ( (*in) >>  19  ) ;
    ++in;
    *out |= ((*in) % (1U<< 12 ))<<( 25 - 12 );
    *out += base;
    out++;
    *out = ( (*in) >>  12  ) ;
    ++in;
    *out |= ((*in) % (1U<< 5 ))<<( 25 - 5 );
    *out += base;
    out++;
    *out = ( (*in) >>  5  )   % (1U << 25 )  ;
    *out += base;
    out++;
    *out = ( (*in) >>  30  ) ;
    ++in;
    *out |= ((*in) % (1U<< 23 ))<<( 25 - 23 );
    *out += base;
    out++;
    *out = ( (*in) >>  23  ) ;
    ++in;
    *out |= ((*in) % (1U<< 16 ))<<( 25 - 16 );
    *out += base;
    out++;

    return in + 1;
}